

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

Ptr __thiscall core::image::load_png_file(image *this,string *filename)

{
  png_infop ppVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  FileException *this_00;
  int *piVar6;
  Exception *this_01;
  TypedImageBase<unsigned_char> *pTVar7;
  reference pvVar8;
  reference ppuVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar10;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> row_pointers;
  ImageData *data;
  int color_type;
  allocator local_69;
  string local_68 [36];
  uint local_44;
  png_infop ppStack_40;
  int bit_depth;
  png_infop png_info;
  png_structp png;
  ImageHeaders headers;
  FILE *fp;
  string *filename_local;
  Ptr *image;
  
  pcVar5 = (char *)std::__cxx11::string::c_str();
  headers._8_8_ = fopen(pcVar5,"rb");
  if ((FILE *)headers._8_8_ == (FILE *)0x0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar6 = __errno_location();
    pcVar5 = strerror(*piVar6);
    util::FileException::FileException(this_00,filename,pcVar5);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  png_info = (png_infop)0x0;
  ppStack_40 = (png_infop)0x0;
  anon_unknown_19::load_png_headers_intern
            ((FILE *)headers._8_8_,(ImageHeaders *)&png,(png_structp *)&png_info,
             &stack0xffffffffffffffc0);
  bVar2 = png_get_bit_depth(png_info,ppStack_40);
  local_44 = (uint)bVar2;
  if (local_44 < 9) {
    cVar3 = png_get_color_type(png_info,ppStack_40);
    if (cVar3 == '\x03') {
      png_set_palette_to_rgb(png_info);
    }
    if ((cVar3 == '\0') && ((int)local_44 < 8)) {
      png_set_expand_gray_1_2_4_to_8(png_info);
    }
    iVar4 = png_get_valid(png_info,ppStack_40,0x10);
    if (iVar4 != 0) {
      png_set_tRNS_to_alpha(png_info);
    }
    png_read_update_info(png_info,ppStack_40);
    Image<unsigned_char>::create();
    pTVar7 = &std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<unsigned_char>;
    TypedImageBase<unsigned_char>::allocate(pTVar7,(int)png,png._4_4_,headers.width);
    pTVar7 = &std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this)->super_TypedImageBase<unsigned_char>;
    row_pointers.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)TypedImageBase<unsigned_char>::get_data(pTVar7);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_a8);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::resize
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_a8,(long)png._4_4_
              );
    for (local_ac = 0; ppVar1 = png_info, local_ac < png._4_4_; local_ac = local_ac + 1) {
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          row_pointers.
                          super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(local_ac * (int)png * headers.width));
      ppuVar9 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_a8,
                           (long)local_ac);
      *ppuVar9 = pvVar8;
    }
    ppuVar9 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_a8,0);
    png_read_image(ppVar1,ppuVar9);
    png_destroy_read_struct(&png_info,&stack0xffffffffffffffc0,0);
    fclose((FILE *)headers._8_8_);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector
              ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_a8);
    PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  png_destroy_read_struct(&png_info,&stack0xffffffffffffffc0,0);
  fclose((FILE *)headers._8_8_);
  this_01 = (Exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"PNG with more than 8 bit",&local_69);
  util::Exception::Exception(this_01,(string *)local_68);
  __cxa_throw(this_01,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

ByteImage::Ptr
load_png_file (std::string const& filename)
{
    // TODO: use throw-safe FILE* wrapper
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    /* Read PNG header info. */
    ImageHeaders headers;
    png_structp png = nullptr;
    png_infop png_info = nullptr;
    load_png_headers_intern(fp, &headers, &png, &png_info);

    /* Check if bit depth is valid. */
    int const bit_depth = png_get_bit_depth(png, png_info);
    if (bit_depth > 8)
    {
        png_destroy_read_struct(&png, &png_info, nullptr);
        std::fclose(fp);
        throw util::Exception("PNG with more than 8 bit");
    }

    /* Apply transformations. */
    int const color_type = png_get_color_type(png, png_info);
    if (color_type == PNG_COLOR_TYPE_PALETTE)
        png_set_palette_to_rgb(png);
    if (color_type == PNG_COLOR_TYPE_GRAY && bit_depth < 8)
        png_set_expand_gray_1_2_4_to_8(png);
    if (png_get_valid(png, png_info, PNG_INFO_tRNS))
        png_set_tRNS_to_alpha(png);

    /* Update the info struct to reflect the transformations. */
    png_read_update_info(png, png_info);

    /* Create image. */
    ByteImage::Ptr image = ByteImage::create();
    image->allocate(headers.width, headers.height, headers.channels);
    ByteImage::ImageData& data = image->get_data();

    /* Setup row pointers. */
    std::vector<png_bytep> row_pointers;
    row_pointers.resize(headers.height);
    for (int i = 0; i < headers.height; ++i)
        row_pointers[i] = &data[i * headers.width * headers.channels];

    /* Read the whole PNG in memory. */
    png_read_image(png, &row_pointers[0]);

    /* Clean up. */
    png_destroy_read_struct(&png, &png_info, nullptr);
    std::fclose(fp);

    return image;
}